

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjuliancalendar.cpp
# Opt level: O0

YearMonthDay __thiscall QJulianCalendar::julianDayToDate(QJulianCalendar *this,qint64 jd)

{
  long in_RSI;
  long in_FS_OFFSET;
  R_conflict15 RVar1;
  R_conflict20 RVar2;
  YearMonthDay YVar3;
  int y;
  R_conflict20 ymd;
  R_conflict15 year4Day;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  int dayInYear;
  int local_70;
  int local_40;
  int local_38;
  int iStack_34;
  YearMonthDay local_14;
  long local_8;
  
  dayInYear = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  RVar1 = QRoundingDown::qDivMod<1461U,_long_long,_true>(in_RSI * 4 + -0x690c75);
  QRoundingDown::qDiv<4u,long_long>(CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  RVar2 = QRomanCalendrical::dayInYearToYmd(dayInYear);
  local_40 = RVar2.day;
  local_38 = RVar2.year;
  local_70 = (int)RVar1.quotient + local_38;
  if (local_70 < 1) {
    local_70 = local_70 + -1;
  }
  iStack_34 = RVar2.month;
  QCalendar::YearMonthDay::YearMonthDay(&local_14,local_70,iStack_34,local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  YVar3.day = local_14.day;
  YVar3.year = local_14.year;
  YVar3.month = local_14.month;
  return YVar3;
}

Assistant:

QCalendar::YearMonthDay QJulianCalendar::julianDayToDate(qint64 jd) const
{
    const auto year4Day = qDivMod<FourYears>(4 * (jd - JulianBaseJd) - 1);
    // Its remainder changes by 4 per day, except at roughly yearly quotient steps.
    const auto ymd = dayInYearToYmd(qDiv<4>(year4Day.remainder));
    const int y = year4Day.quotient + ymd.year;
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, ymd.month, ymd.day);
}